

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathMatrix3.cpp
# Opt level: O1

void COLLADABU::Math::Matrix3::golubKahanStep(Matrix3 *kA,Matrix3 *kL,Matrix3 *kR)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  dVar10 = kA->m[1][1];
  dVar12 = kA->m[1][2];
  dVar8 = kA->m[2][2];
  dVar7 = kA->m[0][1];
  dVar7 = dVar7 * dVar7 + dVar10 * dVar10;
  dVar9 = dVar12 * dVar12 + dVar8 * dVar8;
  dVar11 = dVar7 + dVar9;
  dVar7 = dVar7 - dVar9;
  dVar8 = dVar7 * dVar7 + dVar12 * dVar10 * 4.0 * dVar12 * dVar10;
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  dVar7 = (dVar8 + dVar11) * 0.5;
  dVar10 = (dVar11 - dVar8) * 0.5;
  uVar6 = -(ulong)(ABS(dVar7 - dVar9) <= ABS(dVar10 - dVar9));
  dVar8 = kA->m[0][1];
  dVar10 = kA->m[0][0] - (double)(~uVar6 & (ulong)dVar10 | uVar6 & (ulong)dVar7);
  dVar7 = dVar10 * dVar10 + dVar8 * dVar8;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  dVar13 = -dVar10 * (1.0 / dVar7);
  dVar8 = dVar8 * (1.0 / dVar7);
  dVar11 = -dVar8;
  dVar10 = kA->m[0][0];
  dVar12 = kA->m[0][1];
  dVar9 = kA->m[1][1];
  dVar7 = dVar10 * dVar8 + dVar12 * dVar13;
  auVar2._8_4_ = SUB84(dVar7,0);
  auVar2._0_8_ = dVar10 * dVar13 + dVar12 * dVar11;
  auVar2._12_4_ = (int)((ulong)dVar7 >> 0x20);
  *(undefined1 (*) [16])kA->m[0] = auVar2;
  kA->m[1][0] = dVar9 * dVar11;
  kA->m[1][1] = dVar9 * dVar13;
  lVar5 = -0x18;
  do {
    dVar7 = *(double *)((long)kR->m[1] + lVar5);
    dVar10 = *(double *)((long)kR->m[2] + lVar5);
    *(double *)((long)kR->m[1] + lVar5) = dVar13 * dVar7 + dVar10 * dVar11;
    *(double *)((long)kR->m[2] + lVar5) = dVar7 * dVar8 + dVar10 * dVar13;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0);
  dVar8 = kA->m[0][0];
  dVar7 = kA->m[1][0];
  dVar10 = dVar8 * dVar8 + dVar7 * dVar7;
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  dVar12 = -dVar8 * (1.0 / dVar10);
  dVar7 = dVar7 * (1.0 / dVar10);
  dVar8 = kA->m[0][1];
  dVar10 = kA->m[1][1];
  kA->m[0][0] = dVar12 * kA->m[0][0] - kA->m[1][0] * dVar7;
  kA->m[0][1] = dVar12 * dVar8 - dVar10 * dVar7;
  kA->m[1][1] = dVar8 * dVar7 + dVar10 * dVar12;
  dVar8 = kA->m[1][2];
  kA->m[0][2] = dVar8 * -dVar7;
  kA->m[1][2] = dVar8 * dVar12;
  lVar5 = 0;
  do {
    dVar8 = *(double *)((long)kL->m[0] + lVar5);
    dVar10 = *(double *)((long)kL->m[0] + lVar5 + 8);
    pdVar1 = (double *)((long)kL->m[0] + lVar5);
    *pdVar1 = dVar8 * dVar12 + dVar10 * -dVar7;
    pdVar1[1] = dVar8 * dVar7 + dVar10 * dVar12;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x48);
  dVar8 = kA->m[0][1];
  dVar7 = kA->m[0][2];
  dVar10 = dVar8 * dVar8 + dVar7 * dVar7;
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  dVar12 = kA->m[1][1];
  dVar9 = kA->m[1][2];
  dVar13 = -dVar8 * (1.0 / dVar10);
  dVar7 = dVar7 * (1.0 / dVar10);
  dVar11 = -dVar7;
  kA->m[0][1] = kA->m[0][1] * dVar13 - kA->m[0][2] * dVar7;
  dVar8 = dVar12 * dVar7 + dVar9 * dVar13;
  auVar3._8_4_ = SUB84(dVar8,0);
  auVar3._0_8_ = dVar12 * dVar13 + dVar9 * dVar11;
  auVar3._12_4_ = (int)((ulong)dVar8 >> 0x20);
  *(undefined1 (*) [16])(kA->m[1] + 1) = auVar3;
  dVar8 = kA->m[2][2];
  dVar10 = dVar8 * dVar13;
  auVar4._8_4_ = SUB84(dVar10,0);
  auVar4._0_8_ = dVar8 * dVar11;
  auVar4._12_4_ = (int)((ulong)dVar10 >> 0x20);
  *(undefined1 (*) [16])(kA->m[2] + 1) = auVar4;
  lVar5 = -0x18;
  do {
    dVar8 = *(double *)((long)kR->m[2] + lVar5);
    dVar10 = *(double *)((long)kR[1].m[0] + lVar5);
    *(double *)((long)kR->m[2] + lVar5) = dVar13 * dVar8 + dVar10 * dVar11;
    *(double *)((long)kR[1].m[0] + lVar5) = dVar8 * dVar7 + dVar10 * dVar13;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0);
  dVar8 = kA->m[1][1];
  dVar7 = kA->m[2][1];
  dVar10 = dVar8 * dVar8 + dVar7 * dVar7;
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  dVar12 = -dVar8 * (1.0 / dVar10);
  dVar7 = dVar7 * (1.0 / dVar10);
  dVar8 = kA->m[1][2];
  dVar10 = kA->m[2][2];
  kA->m[1][1] = dVar12 * kA->m[1][1] - kA->m[2][1] * dVar7;
  kA->m[1][2] = dVar12 * dVar8 - dVar10 * dVar7;
  kA->m[2][2] = dVar8 * dVar7 + dVar10 * dVar12;
  lVar5 = 0;
  do {
    dVar8 = *(double *)((long)kL->m[0] + lVar5 + 8);
    dVar10 = *(double *)((long)kL->m[0] + lVar5 + 0x10);
    pdVar1 = (double *)((long)kL->m[0] + lVar5 + 8);
    *pdVar1 = dVar8 * dVar12 + dVar10 * -dVar7;
    pdVar1[1] = dVar8 * dVar7 + dVar10 * dVar12;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x48);
  return;
}

Assistant:

void Matrix3::golubKahanStep ( Matrix3& kA, Matrix3& kL,
                                       Matrix3& kR )
        {
            Real fT11 = kA[ 0 ][ 1 ] * kA[ 0 ][ 1 ] + kA[ 1 ][ 1 ] * kA[ 1 ][ 1 ];
            Real fT22 = kA[ 1 ][ 2 ] * kA[ 1 ][ 2 ] + kA[ 2 ][ 2 ] * kA[ 2 ][ 2 ];
            Real fT12 = kA[ 1 ][ 1 ] * kA[ 1 ][ 2 ];
            Real fTrace = fT11 + fT22;
            Real fDiff = fT11 - fT22;
            Real fDiscr = sqrt( fDiff * fDiff + 4.0 * fT12 * fT12 );
            Real fRoot1 = 0.5 * ( fTrace + fDiscr );
            Real fRoot2 = 0.5 * ( fTrace - fDiscr );

            // adjust right
            Real fY = kA[ 0 ][ 0 ] - ( std::abs( fRoot1 - fT22 ) <=
                                       std::abs( fRoot2 - fT22 ) ? fRoot1 : fRoot2 );
            Real fZ = kA[ 0 ][ 1 ];
            Real fInvLength = 1/sqrt( fY * fY + fZ * fZ );
            Real fSin = fZ * fInvLength;
            Real fCos = -fY * fInvLength;

            Real fTmp0 = kA[ 0 ][ 0 ];
            Real fTmp1 = kA[ 0 ][ 1 ];
            kA[ 0 ][ 0 ] = fCos * fTmp0 - fSin * fTmp1;
            kA[ 0 ][ 1 ] = fSin * fTmp0 + fCos * fTmp1;
            kA[ 1 ][ 0 ] = -fSin * kA[ 1 ][ 1 ];
            kA[ 1 ][ 1 ] *= fCos;

            size_t iRow;

            for ( iRow = 0; iRow < 3; iRow++ )
            {
                fTmp0 = kR[ 0 ][ iRow ];
                fTmp1 = kR[ 1 ][ iRow ];
                kR[ 0 ][ iRow ] = fCos * fTmp0 - fSin * fTmp1;
                kR[ 1 ][ iRow ] = fSin * fTmp0 + fCos * fTmp1;
            }

            // adjust left
            fY = kA[ 0 ][ 0 ];

            fZ = kA[ 1 ][ 0 ];

            fInvLength = 1/sqrt( fY * fY + fZ * fZ );

            fSin = fZ * fInvLength;

            fCos = -fY * fInvLength;

            kA[ 0 ][ 0 ] = fCos * kA[ 0 ][ 0 ] - fSin * kA[ 1 ][ 0 ];

            fTmp0 = kA[ 0 ][ 1 ];

            fTmp1 = kA[ 1 ][ 1 ];

            kA[ 0 ][ 1 ] = fCos * fTmp0 - fSin * fTmp1;

            kA[ 1 ][ 1 ] = fSin * fTmp0 + fCos * fTmp1;

            kA[ 0 ][ 2 ] = -fSin * kA[ 1 ][ 2 ];

            kA[ 1 ][ 2 ] *= fCos;

            size_t iCol;

            for ( iCol = 0; iCol < 3; iCol++ )
            {
                fTmp0 = kL[ iCol ][ 0 ];
                fTmp1 = kL[ iCol ][ 1 ];
                kL[ iCol ][ 0 ] = fCos * fTmp0 - fSin * fTmp1;
                kL[ iCol ][ 1 ] = fSin * fTmp0 + fCos * fTmp1;
            }

            // adjust right
            fY = kA[ 0 ][ 1 ];

            fZ = kA[ 0 ][ 2 ];

            fInvLength = 1/sqrt( fY * fY + fZ * fZ );

            fSin = fZ * fInvLength;

            fCos = -fY * fInvLength;

            kA[ 0 ][ 1 ] = fCos * kA[ 0 ][ 1 ] - fSin * kA[ 0 ][ 2 ];

            fTmp0 = kA[ 1 ][ 1 ];

            fTmp1 = kA[ 1 ][ 2 ];

            kA[ 1 ][ 1 ] = fCos * fTmp0 - fSin * fTmp1;

            kA[ 1 ][ 2 ] = fSin * fTmp0 + fCos * fTmp1;

            kA[ 2 ][ 1 ] = -fSin * kA[ 2 ][ 2 ];

            kA[ 2 ][ 2 ] *= fCos;

            for ( iRow = 0; iRow < 3; iRow++ )
            {
                fTmp0 = kR[ 1 ][ iRow ];
                fTmp1 = kR[ 2 ][ iRow ];
                kR[ 1 ][ iRow ] = fCos * fTmp0 - fSin * fTmp1;
                kR[ 2 ][ iRow ] = fSin * fTmp0 + fCos * fTmp1;
            }

            // adjust left
            fY = kA[ 1 ][ 1 ];

            fZ = kA[ 2 ][ 1 ];

            fInvLength = 1/sqrt( fY * fY + fZ * fZ );

            fSin = fZ * fInvLength;

            fCos = -fY * fInvLength;

            kA[ 1 ][ 1 ] = fCos * kA[ 1 ][ 1 ] - fSin * kA[ 2 ][ 1 ];

            fTmp0 = kA[ 1 ][ 2 ];

            fTmp1 = kA[ 2 ][ 2 ];

            kA[ 1 ][ 2 ] = fCos * fTmp0 - fSin * fTmp1;

            kA[ 2 ][ 2 ] = fSin * fTmp0 + fCos * fTmp1;

            for ( iCol = 0; iCol < 3; iCol++ )
            {
                fTmp0 = kL[ iCol ][ 1 ];
                fTmp1 = kL[ iCol ][ 2 ];
                kL[ iCol ][ 1 ] = fCos * fTmp0 - fSin * fTmp1;
                kL[ iCol ][ 2 ] = fSin * fTmp0 + fCos * fTmp1;
            }
        }